

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_long_long_&,_const_long_&> * __thiscall
Catch::ExprLhs<long_long_const&>::operator==
          (BinaryExpr<const_long_long_&,_const_long_&> *__return_storage_ptr__,
          ExprLhs<long_long_const&> *this,long *rhs)

{
  longlong *lhs;
  bool comparisonResult;
  StringRef local_30;
  long *local_20;
  long *rhs_local;
  ExprLhs<const_long_long_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (long *)this;
  this_local = (ExprLhs<const_long_long_&> *)__return_storage_ptr__;
  comparisonResult = compareEqual<long_long,long>(*(longlong **)this,rhs);
  lhs = *(longlong **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_long_long_&,_const_long_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }